

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O0

ostream * __thiscall wasm::PrintSExpression::printHeapTypeName(PrintSExpression *this,HeapType type)

{
  bool bVar1;
  TypeNames local_70;
  PrintSExpression *local_28;
  PrintSExpression *local_20;
  PrintSExpression *this_local;
  HeapType type_local;
  
  local_20 = this;
  this_local = (PrintSExpression *)type.id;
  bVar1 = HeapType::isBasic((HeapType *)&this_local);
  if (bVar1) {
    local_28 = this_local;
    type_local.id = (uintptr_t)wasm::operator<<(this->o,(HeapType)this_local);
  }
  else {
    TypePrinter::getNames(&local_70,&this->typePrinter,(HeapType)this_local);
    type_local.id = (uintptr_t)wasm::Name::print(&local_70.name,this->o);
    TypeNames::~TypeNames(&local_70);
  }
  return (ostream *)type_local.id;
}

Assistant:

std::ostream& printHeapTypeName(HeapType type) {
    if (type.isBasic()) {
      return o << type;
    }
    return typePrinter.getNames(type).name.print(o);
  }